

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

BuildingInfo * __thiscall RenX::Server::getBuildingByName(Server *this,string_view name)

{
  pointer puVar1;
  bool bVar2;
  char *in_RCX;
  pointer puVar3;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  
  rhs._M_len = name._M_str;
  puVar3 = (this->buildings).
           super__Vector_base<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->buildings).
           super__Vector_base<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar3 == puVar1) {
      return (BuildingInfo *)0x0;
    }
    rhs._M_str = in_RCX;
    bVar2 = jessilib::equalsi<char,char>
                      ((jessilib *)
                       (puVar3->_M_t).
                       super___uniq_ptr_impl<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_RenX::BuildingInfo_*,_std::default_delete<RenX::BuildingInfo>_>
                       .super__Head_base<0UL,_RenX::BuildingInfo_*,_false>._M_head_impl,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       name._M_len,rhs);
    if (bVar2) break;
    puVar3 = puVar3 + 1;
  }
  return (puVar3->_M_t).
         super___uniq_ptr_impl<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>._M_t.
         super__Tuple_impl<0UL,_RenX::BuildingInfo_*,_std::default_delete<RenX::BuildingInfo>_>.
         super__Head_base<0UL,_RenX::BuildingInfo_*,_false>._M_head_impl;
}

Assistant:

RenX::BuildingInfo *RenX::Server::getBuildingByName(std::string_view name) const {
	for (const auto& building : buildings) {
		if (jessilib::equalsi(building->name, name)) {
			return building.get();
		}
	}

	return nullptr;
}